

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.cpp
# Opt level: O3

int cppcms_capi_session_get_exposed(cppcms_capi_session *session,char *key)

{
  session_interface *this;
  bool bVar1;
  uint uVar2;
  allocator local_49;
  string local_48;
  
  uVar2 = 0xffffffff;
  if (session != (cppcms_capi_session *)0x0) {
    anon_unknown.dwarf_418ba7::check_str(key);
    cppcms_capi_session::check_loaded(session);
    this = (session->p).ptr_;
    std::__cxx11::string::string((string *)&local_48,key,&local_49);
    bVar1 = cppcms::session_interface::is_exposed(this,&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p);
    }
    uVar2 = (uint)bVar1;
  }
  return uVar2;
}

Assistant:

int cppcms_capi_session_get_exposed(cppcms_capi_session *session,char const *key)
{
	TRY {
		if(!session)
			return -1;
		check_str(key);
		session->check_loaded();
		return session->p->is_exposed(key);
	}